

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O2

sysbvm_tuple_t sysbvm_orderedCollection_at(sysbvm_tuple_t orderedCollection,size_t index)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  
  if ((orderedCollection & 0xf) == 0 && orderedCollection != 0) {
    uVar1 = *(ulong *)(orderedCollection + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar1 = (long)uVar1 >> 4;
    }
    else {
      uVar1 = *(ulong *)(uVar1 + 0x10);
    }
    if (index < uVar1) {
      sVar2 = *(sysbvm_tuple_t *)(*(long *)(orderedCollection + 0x18) + 0x10 + index * 8);
    }
    else {
      sVar2 = 0;
      sysbvm_error_indexOutOfBounds();
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_at(sysbvm_tuple_t orderedCollection, size_t index)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection)) return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    if(index >= size)
    {
        sysbvm_error_indexOutOfBounds();
        return SYSBVM_NULL_TUPLE;
    }

    return ((sysbvm_array_t*)orderedCollectionObject->storage)->elements[index];
}